

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O3

JsErrorCode JsGetPropertyIdFromSymbol(JsValueRef symbol,JsPropertyIdRef *propertyId)

{
  ScriptContext *scriptContext;
  ScriptContext *pSVar1;
  bool bVar2;
  JsrtContext *pJVar3;
  RecyclableObject *value;
  JavascriptSymbol *pJVar4;
  JsErrorCode JVar5;
  AutoNestedHandledExceptionType local_58 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  undefined1 auStack_38 [8];
  TTDRecorder _actionEntryPopper;
  
  auStack_38 = (undefined1  [8])0x0;
  _actionEntryPopper.m_actionEvent = (EventLogEntry *)0x0;
  pJVar3 = JsrtContext::GetCurrent();
  if (pJVar3 == (JsrtContext *)0x0) {
    return JsErrorNoCurrentContext;
  }
  scriptContext = (((pJVar3->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr
  ;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_58,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  if (scriptContext->TTDShouldPerformRecordAction == true) {
    TTD::EventLog::RecordJsRTGetPropertyIdFromSymbol
              (scriptContext->threadContext->TTDLog,(TTDJsRTActionResultAutoRecorder *)auStack_38,
               symbol);
  }
  if (symbol == (JsValueRef)0x0) {
    JVar5 = JsErrorInvalidArgument;
  }
  else {
    if ((ulong)symbol >> 0x30 == 0) {
      value = Js::VarTo<Js::RecyclableObject>(symbol);
      pSVar1 = (((((value->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
               scriptContext.ptr;
      if (pSVar1 != scriptContext) {
        JVar5 = JsErrorWrongRuntime;
        if (pSVar1->threadContext != scriptContext->threadContext) goto LAB_0037fac4;
        symbol = Js::CrossSite::MarshalVar(scriptContext,value,false);
      }
    }
    if (propertyId == (JsPropertyIdRef *)0x0) {
      JVar5 = JsErrorNullArgument;
    }
    else {
      *propertyId = (JsPropertyIdRef)0x0;
      bVar2 = Js::VarIs<Js::JavascriptSymbol>(symbol);
      JVar5 = JsErrorPropertyNotSymbol;
      if (bVar2) {
        pJVar4 = Js::VarTo<Js::JavascriptSymbol>(symbol);
        *propertyId = (pJVar4->propertyRecordUsageCache).propertyRecord.ptr;
        JVar5 = JsNoError;
      }
    }
  }
LAB_0037fac4:
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_58);
  if (auStack_38 != (undefined1  [8])0x0) {
    if (*(int32 *)((long)auStack_38 + 4) != -1) {
      TTDAbort_unrecoverable_error("Hmm this got changed somewhere???");
    }
    *(JsErrorCode *)((long)auStack_38 + 4) = JVar5;
  }
  return JVar5;
}

Assistant:

CHAKRA_API JsGetPropertyIdFromSymbol(_In_ JsValueRef symbol, _Out_ JsPropertyIdRef *propertyId)
{
    return ContextAPINoScriptWrapper([&](Js::ScriptContext * scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTGetPropertyIdFromSymbol, symbol);

        VALIDATE_INCOMING_REFERENCE(symbol, scriptContext);
        PARAM_NOT_NULL(propertyId);
        *propertyId = nullptr;

        if (!Js::VarIs<Js::JavascriptSymbol>(symbol))
        {
            return JsErrorPropertyNotSymbol;
        }

        *propertyId = (JsPropertyIdRef)Js::VarTo<Js::JavascriptSymbol>(symbol)->GetValue();
        return JsNoError;
    },
    /*allowInObjectBeforeCollectCallback*/true);
}